

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O2

double __thiscall MetaSim::ParetoVar::getMinimum(ParetoVar *this)

{
  MaxException *this_00;
  allocator local_41;
  string local_40;
  
  this_00 = (MaxException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,"ExponentialVar",&local_41);
  RandomVar::MaxException::MaxException(this_00,&local_40);
  __cxa_throw(this_00,&RandomVar::MaxException::typeinfo,BaseExc::~BaseExc);
}

Assistant:

virtual double getMinimum() throw(MaxException)
            {throw MaxException("ExponentialVar");}